

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Enum::Clear(Enum *this)

{
  InternalMetadata *this_00;
  string *psVar1;
  SourceContext *this_01;
  ulong uVar2;
  void *pvVar3;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
            (&(this->enumvalue_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Option>::TypeHandler>
            (&(this->options_).super_RepeatedPtrFieldBase);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  pvVar3 = this_00->ptr_;
  uVar2 = (ulong)pvVar3 & 1;
  if (uVar2 != 0) {
    pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  if ((pvVar3 == (void *)0x0) && (this_01 = this->source_context_, this_01 != (SourceContext *)0x0))
  {
    SourceContext::~SourceContext(this_01);
    operator_delete(this_01);
    uVar2 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->source_context_ = (SourceContext *)0x0;
  this->syntax_ = 0;
  if (uVar2 != 0) {
    internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>(this_00);
    return;
  }
  return;
}

Assistant:

void Enum::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Enum)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  enumvalue_.Clear();
  options_.Clear();
  name_.ClearToEmpty(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  if (GetArena() == nullptr && source_context_ != nullptr) {
    delete source_context_;
  }
  source_context_ = nullptr;
  syntax_ = 0;
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}